

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

bool __thiscall QMainWindow::isSeparator(QMainWindow *this,QPoint *pos)

{
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayout::findSeparator
            ((QList<int> *)&local_30,
             (QDockAreaLayout *)
             (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x260) + 0x1a0),pos);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_30.size != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::isSeparator(const QPoint &pos) const
{
#if QT_CONFIG(dockwidget)
    Q_D(const QMainWindow);
    return !d->layout->layoutState.dockAreaLayout.findSeparator(pos).isEmpty();
#else
    Q_UNUSED(pos);
    return false;
#endif
}